

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall
backend::codegen::RegAllocator::replace_write(RegAllocator *this,ReplaceWriteAction r,int i)

{
  pointer puVar1;
  Inst *pIVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  Tag *pTVar6;
  Function *pFVar7;
  MemoryOperand *this_00;
  __hashtable *__h;
  Reg RVar8;
  Reg rd;
  anon_class_16_2_94732020 disp_reg;
  allocator<char> local_132;
  allocator<char> local_131;
  undefined1 local_130 [8];
  undefined1 local_128 [32];
  string local_108;
  anon_class_16_2_94732020 local_e8;
  Tag local_d8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  _Variadic_union<arm::RegisterOperand,_short> local_88 [4];
  undefined **local_40;
  undefined8 local_38;
  undefined1 local_30;
  
  local_a8._8_4_ = r.kind;
  pTVar6 = r._0_8_;
  local_e8.r = (ReplaceWriteAction *)local_a8;
  local_e8.i = (int *)(local_a8 + 0xc);
  RVar8 = r.replace_with;
  local_a8._0_8_ = pTVar6;
  local_a8._12_4_ = i;
  if (local_a8._8_4_ != Spill) {
    if (local_a8._8_4_ == Graph) {
      replace_write::anon_class_16_2_94732020::operator()
                ((anon_class_16_2_94732020 *)(local_128 + 0x40));
      local_130._0_4_ = local_130._0_4_ & 0xffffff00;
      AixLog::operator<<((ostream *)local_130,(Severity *)pTVar6);
      AixLog::Tag::Tag(&local_d8);
      AixLog::operator<<((ostream *)&local_d8,pTVar6);
      local_38 = std::chrono::_V2::system_clock::now();
      local_40 = &PTR__Timestamp_001d8f28;
      local_30 = 0;
      AixLog::operator<<((ostream *)&local_40,(Timestamp *)pTVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128,"replace_write",&local_131);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_128 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,&local_132);
      pFVar7 = (Function *)local_128;
      AixLog::Function::Function
                ((Function *)local_98,(string *)pFVar7,(string *)(local_128 + 0x20),0x2fd);
      AixLog::operator<<((ostream *)local_98,pFVar7);
      poVar5 = std::operator<<((ostream *)&std::clog,"graph");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else if (local_a8._8_4_ == Phys) {
      pTVar6 = (Tag *)local_98;
      local_98._8_4_ = 0xffffffff;
      local_98._0_4_ = RVar8;
      local_98._4_4_ = i;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->active);
      replace_write::anon_class_16_2_94732020::operator()
                ((anon_class_16_2_94732020 *)(local_128 + 0x40));
      local_130._0_4_ = local_130._0_4_ & 0xffffff00;
      AixLog::operator<<((ostream *)local_130,(Severity *)pTVar6);
      AixLog::Tag::Tag(&local_d8);
      AixLog::operator<<((ostream *)&local_d8,pTVar6);
      local_38 = std::chrono::_V2::system_clock::now();
      local_40 = &PTR__Timestamp_001d8f28;
      local_30 = 0;
      AixLog::operator<<((ostream *)&local_40,(Timestamp *)pTVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128,"replace_write",&local_131);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_128 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,&local_132);
      pFVar7 = (Function *)local_128;
      AixLog::Function::Function
                ((Function *)local_98,(string *)pFVar7,(string *)(local_128 + 0x20),0x2f8);
      AixLog::operator<<((ostream *)local_98,pFVar7);
      poVar5 = std::operator<<((ostream *)&std::clog,"phys ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      replace_write::anon_class_16_2_94732020::operator()
                ((anon_class_16_2_94732020 *)(local_128 + 0x40));
      local_130._0_4_ = local_130._0_4_ & 0xffffff00;
      AixLog::operator<<((ostream *)local_130,(Severity *)pTVar6);
      AixLog::Tag::Tag(&local_d8);
      AixLog::operator<<((ostream *)&local_d8,pTVar6);
      local_38 = std::chrono::_V2::system_clock::now();
      local_40 = &PTR__Timestamp_001d8f28;
      local_30 = 0;
      AixLog::operator<<((ostream *)&local_40,(Timestamp *)pTVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128,"replace_write",&local_131);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_128 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,&local_132);
      pFVar7 = (Function *)local_128;
      AixLog::Function::Function
                ((Function *)local_98,(string *)pFVar7,(string *)(local_128 + 0x20),0x319);
      AixLog::operator<<((ostream *)local_98,pFVar7);
      poVar5 = std::operator<<((ostream *)&std::clog,"temp");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    goto LAB_001626dd;
  }
  local_130._0_4_ = RVar8;
  iVar4 = get_or_alloc_spill_pos(this,r.from);
  puVar1 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((puVar1 == (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) ||
     (pIVar2 = puVar1[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
     (pIVar2->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db9c0)) {
LAB_00162488:
    local_108._M_dataplus._M_p._0_4_ = 0x1c;
    local_88[0]._0_2_ = (short)this->stack_offset + (short)iVar4;
    local_98._0_4_ = 0x1db800;
    local_98._4_4_ = 0;
    local_98._8_4_ = local_98._8_4_ & 0xffffff00;
    local_98._12_4_ = 0xd;
    local_88[1]._0_1_ = '\x01';
    std::
    make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
              ((OpCode *)local_128,(uint *)(local_128 + 0x20),(MemoryOperand *)local_130,local_98);
    local_d8._vptr_Tag = (_func_int **)local_128._0_8_;
    local_128._0_8_ = (LoadStoreInst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst_sink,
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_d8);
    if ((LoadStoreInst *)local_d8._vptr_Tag != (LoadStoreInst *)0x0) {
      (*(((Inst *)local_d8._vptr_Tag)->super_Displayable)._vptr_Displayable[2])();
    }
    local_d8._vptr_Tag = (_func_int **)0x0;
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)local_128
              );
  }
  else {
    this_00 = (MemoryOperand *)0x0;
    if ((char)pIVar2[4].op == B) {
      this_00 = (MemoryOperand *)&pIVar2[1].op;
    }
    if (((pIVar2->op != StR) || (this_00->r1 != RVar8)) || (pIVar2->cond != this->cur_cond))
    goto LAB_00162488;
    local_88[0]._0_2_ = (short)this->stack_offset + (short)iVar4;
    local_98._0_4_ = 0x1db800;
    local_98._4_4_ = 0;
    local_98._8_4_ = local_98._8_4_ & 0xffffff00;
    local_98._12_4_ = 0xd;
    local_88[1]._0_1_ = '\x01';
    bVar3 = arm::MemoryOperand::operator==(this_00,(MemoryOperand *)local_98);
    if (!bVar3) goto LAB_00162488;
  }
  pTVar6 = (Tag *)local_a8;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->wrote_to)._M_h);
  replace_write::anon_class_16_2_94732020::operator()
            ((anon_class_16_2_94732020 *)(local_128 + 0x40));
  local_131 = (allocator<char>)0x0;
  AixLog::operator<<((ostream *)&local_131,(Severity *)pTVar6);
  AixLog::Tag::Tag(&local_d8);
  AixLog::operator<<((ostream *)&local_d8,pTVar6);
  local_38 = std::chrono::_V2::system_clock::now();
  local_40 = &PTR__Timestamp_001d8f28;
  local_30 = 0;
  AixLog::operator<<((ostream *)&local_40,(Timestamp *)pTVar6);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"replace_write",&local_132)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_128 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,(allocator<char> *)(local_130 + 7));
  pFVar7 = (Function *)local_128;
  AixLog::Function::Function
            ((Function *)local_98,(string *)pFVar7,(string *)(local_128 + 0x20),0x316);
  AixLog::operator<<((ostream *)local_98,pFVar7);
  poVar5 = std::operator<<((ostream *)&std::clog,"spill ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_001626dd:
  AixLog::Function::~Function((Function *)local_98);
  std::__cxx11::string::~string((string *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)local_128);
  AixLog::Tag::~Tag(&local_d8);
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}